

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O1

string * __thiscall
MADPComponentDiscreteStates::SoftPrintInitialStateDistribution_abi_cxx11_
          (string *__return_storage_ptr__,MADPComponentDiscreteStates *this)

{
  undefined8 *puVar1;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  if (this->_m_initialized != false) {
    (*(this->_m_initialStateDistribution->super_StateDistribution)._vptr_StateDistribution[6])();
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"MADPComponentDiscreteStates::PrintInitialStateDistribution(",0x3b);
  std::__ostream_insert<char,std::char_traits<char>>(local_188,") - Error: not initialized. ",0x1c);
  std::endl<char,std::char_traits<char>>(local_188);
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar1 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar1,&E::typeinfo,E::~E);
}

Assistant:

string MADPComponentDiscreteStates::SoftPrintInitialStateDistribution() const
{
    if(!_m_initialized)
    {
        stringstream ss;
        ss << "MADPComponentDiscreteStates::PrintInitialStateDistribution("<< 
        ") - Error: not initialized. " <<endl;
        throw E(ss);
    }
    return(_m_initialStateDistribution->SoftPrint());
}